

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O0

bool IsFloat(char *str)

{
  char *pcVar1;
  bool local_21;
  char *local_20;
  char *pt;
  char *str_local;
  
  if ((*str == '+') || (pt = str, *str == '-')) {
    pt = str + 1;
  }
  if (*pt == '.') {
    local_20 = pt;
  }
  else {
    local_20 = IsNum(pt);
    if (local_20 == (char *)0x0) {
      return false;
    }
  }
  if ((*local_20 == '.') && (local_20 = IsNum(local_20 + 1), local_20 == (char *)0x0)) {
    str_local._7_1_ = false;
  }
  else {
    if ((*local_20 == 'e') || (*local_20 == 'E')) {
      pcVar1 = local_20 + 1;
      if ((*pcVar1 == '+') || (*pcVar1 == '-')) {
        pcVar1 = local_20 + 2;
      }
      local_20 = pcVar1;
      local_20 = IsNum(local_20);
    }
    local_21 = false;
    if (local_20 != (char *)0x0) {
      local_21 = *local_20 == '\0';
    }
    str_local._7_1_ = local_21;
  }
  return str_local._7_1_;
}

Assistant:

bool IsFloat (const char *str)
{
	const char *pt;
	
	if (*str == '+' || *str == '-')
		str++;

	if (*str == '.')
	{
		pt = str;
	}
	else
	{
		pt = IsNum (str);
		if (pt == NULL)
			return false;
	}
	if (*pt == '.')
	{
		pt = IsNum (pt+1);
		if (pt == NULL)
			return false;
	}
	if (*pt == 'e' || *pt == 'E')
	{
		pt++;
		if (*pt == '+' || *pt == '-')
			pt++;
		pt = IsNum (pt);
	}
	return pt != NULL && *pt == 0;
}